

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::SliceStaticLayerParams::ByteSizeLong(SliceStaticLayerParams *this)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  int cached_size;
  int cached_size_6;
  size_t data_size_5;
  uint count_2;
  int cached_size_5;
  size_t data_size_4;
  int cached_size_4;
  size_t data_size_3;
  uint count_1;
  int cached_size_3;
  size_t data_size_2;
  int cached_size_2;
  size_t data_size_1;
  uint count;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  SliceStaticLayerParams *this_local;
  
  data_size = 0;
  sVar3 = google::protobuf::internal::WireFormatLite::Int64Size(&this->beginids_);
  if (sVar3 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_beginids_cached_byte_size_ = iVar1;
  data_size = sVar3 + data_size;
  uVar2 = beginmasks_size(this);
  uVar5 = (ulong)uVar2;
  if (uVar5 != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(uVar2);
    data_size = sVar3 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(uVar5);
  this->_beginmasks_cached_byte_size_ = iVar1;
  data_size = uVar5 + data_size;
  sVar3 = google::protobuf::internal::WireFormatLite::Int64Size(&this->endids_);
  if (sVar3 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_endids_cached_byte_size_ = iVar1;
  data_size = sVar3 + data_size;
  uVar2 = endmasks_size(this);
  uVar5 = (ulong)uVar2;
  if (uVar5 != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(uVar2);
    data_size = sVar3 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(uVar5);
  this->_endmasks_cached_byte_size_ = iVar1;
  data_size = uVar5 + data_size;
  sVar3 = google::protobuf::internal::WireFormatLite::Int64Size(&this->strides_);
  if (sVar3 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_strides_cached_byte_size_ = iVar1;
  data_size = sVar3 + data_size;
  uVar2 = squeezemasks_size(this);
  uVar5 = (ulong)uVar2;
  if (uVar5 != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(uVar2);
    data_size = sVar3 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(uVar5);
  this->_squeezemasks_cached_byte_size_ = iVar1;
  iVar1 = google::protobuf::internal::ToCachedSize(uVar5 + data_size);
  this->_cached_size_ = iVar1;
  return uVar5 + data_size;
}

Assistant:

size_t SliceStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SliceStaticLayerParams)
  size_t total_size = 0;

  // repeated int64 beginIds = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->beginids_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _beginids_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool beginMasks = 2;
  {
    unsigned int count = this->beginmasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _beginmasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int64 endIds = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->endids_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _endids_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool endMasks = 4;
  {
    unsigned int count = this->endmasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _endmasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int64 strides = 5;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->strides_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _strides_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated bool squeezeMasks = 6;
  {
    unsigned int count = this->squeezemasks_size();
    size_t data_size = 1UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _squeezemasks_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}